

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAgi.c
# Opt level: O0

int Agi_ManSuppSize_rec(Agi_Man_t *p,int i)

{
  int iVar1;
  int iVar2;
  int i_local;
  Agi_Man_t *p_local;
  
  if (p->pTravIds[i] == p->nTravIds) {
    p_local._4_4_ = 0;
  }
  else {
    p->pTravIds[i] = p->nTravIds;
    iVar1 = Agi_ObjIsCi(p,i);
    if (iVar1 == 0) {
      iVar1 = Agi_ObjIsAnd(p,i);
      if (iVar1 == 0) {
        __assert_fail("Agi_ObjIsAnd(p, i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaAgi.c"
                      ,0xcb,"int Agi_ManSuppSize_rec(Agi_Man_t *, int)");
      }
      iVar1 = Agi_ObjVar0(p,i);
      iVar1 = Agi_ManSuppSize_rec(p,iVar1);
      iVar2 = Agi_ObjVar1(p,i);
      iVar2 = Agi_ManSuppSize_rec(p,iVar2);
      p_local._4_4_ = iVar1 + iVar2;
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Agi_ManSuppSize_rec( Agi_Man_t * p, int i )
{
    if ( p->pTravIds[i] == p->nTravIds )
        return 0;
    p->pTravIds[i] = p->nTravIds;
    if ( Agi_ObjIsCi(p, i) )
        return 1;
    assert( Agi_ObjIsAnd(p, i) );
    return Agi_ManSuppSize_rec( p, Agi_ObjVar0(p, i) ) +  Agi_ManSuppSize_rec( p, Agi_ObjVar1(p, i) );
}